

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  _Bool _Var1;
  uint uVar2;
  curltime cVar3;
  curltime now_00;
  uint state;
  curltime now;
  _Bool dead;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  if ((conn->easyq).size == 0) {
    cVar3 = Curl_now();
    now_00._12_4_ = 0;
    now_00.tv_sec = SUB128(cVar3._0_12_,0);
    now_00.tv_usec = SUB124(cVar3._0_12_,8);
    _Var1 = conn_maxage(data,conn,now_00);
    if (_Var1) {
      now._15_1_ = 1;
    }
    else if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0
            ) {
      now._15_1_ = SocketIsDead(conn->sock[0]);
    }
    else {
      Curl_attach_connection(data,conn);
      uVar2 = (*conn->handler->connection_check)(data,conn,1);
      now._15_1_ = (uVar2 & 1) != 0;
      Curl_detach_connection(data);
    }
    if (now._15_1_ != '\0') {
      Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
      Curl_conncache_remove_conn(data,conn,false);
      return true;
    }
  }
  return false;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection isn't in
       use */
    bool dead;
    struct curltime now = Curl_now();
    if(conn_maxage(data, conn, now)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      /* Use the general method for determining the death of a connection */
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);
    }

    if(dead) {
      infof(data, "Connection %ld seems to be dead", conn->connection_id);
      Curl_conncache_remove_conn(data, conn, FALSE);
      return TRUE;
    }
  }
  return FALSE;
}